

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O2

void __thiscall
Diffusion::getViscTerms
          (Diffusion *this,MultiFab *visc_terms,int src_comp,int comp,Real time,int rho_flag,
          MultiFab **beta,int betaComp)

{
  NavierStokesBase *pNVar1;
  int betaComp_00;
  int iVar2;
  EBFArrayBoxFactory *pEVar3;
  MultiFab *pMVar4;
  initializer_list<amrex::Geometry> __l;
  initializer_list<amrex::BoxArray> __l_00;
  initializer_list<amrex::DistributionMapping> __l_01;
  initializer_list<const_amrex::EBFArrayBoxFactory_*> __l_02;
  initializer_list<amrex::MultiFab_*> __l_03;
  initializer_list<amrex::MultiFab_*> __l_04;
  allocator_type local_9cc;
  allocator_type local_9cb;
  allocator_type local_9ca;
  allocator_type local_9c9;
  Real local_9c8;
  int local_9bc;
  int local_9b8;
  int local_9b4;
  array<amrex::LinOpBCType,_3UL> mlmg_lobc;
  __shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> local_990;
  array<amrex::LinOpBCType,_3UL> mlmg_hibc;
  int allthere;
  LPInfo local_960;
  _Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
  local_940;
  vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> local_928;
  EBFArrayBoxFactory *local_910;
  undefined1 local_908 [104];
  MLMG mgn;
  MultiFab s_tmp;
  MultiFab visc_tmp;
  MLEBABecLap mlabec;
  
  local_9c8 = time;
  local_9b4 = rho_flag;
  checkBeta(this,beta,&allthere);
  if (is_diffusive.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[comp]
      == 0) {
    amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&visc_terms->super_FabArray<amrex::FArrayBox>,0.0,comp - src_comp,1,
               (visc_terms->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
    return;
  }
  local_9b8 = betaComp;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp = (_func_int **)0x1;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_agglomeration = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_consolidation = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_semicoarsening = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._3_1_ = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.agg_grid_size = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.has_metric_term = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._13_3_ = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_coarsening_level = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_semicoarsening_level = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.semicoarsening_direction = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.hidden_direction = 0;
  local_9bc = src_comp;
  amrex::MultiFab::MultiFab
            (&visc_tmp,this->grids,this->dmap,1,2,(MFInfo *)&mlabec,
             (this->navier_stokes->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size);
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp = (_func_int **)0x1;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_agglomeration = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_consolidation = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.do_semicoarsening = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._3_1_ = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.agg_grid_size = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.has_metric_term = false;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info._13_3_ = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_coarsening_level = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.max_semicoarsening_level = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.semicoarsening_direction = 0;
  mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.hidden_direction = 0;
  amrex::MultiFab::MultiFab
            (&s_tmp,this->grids,this->dmap,1,1,(MFInfo *)&mlabec,
             (this->navier_stokes->super_AmrLevel).m_factory._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.info.con_grid_size);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&visc_tmp.super_FabArray<amrex::FArrayBox>,0.0);
  local_960.do_semicoarsening = false;
  local_960.agg_grid_size = -1;
  local_960.con_grid_size = -1;
  local_960.do_agglomeration = (anonymous_namespace)::agglomeration != 0;
  local_960.has_metric_term = true;
  local_960.do_consolidation = (anonymous_namespace)::consolidation != 0;
  local_960.max_coarsening_level = 0;
  local_960.max_semicoarsening_level = 0;
  local_960.semicoarsening_direction = -1;
  local_960.hidden_direction = -1;
  pNVar1 = this->navier_stokes;
  pEVar3 = (EBFArrayBoxFactory *)
           __dynamic_cast((pNVar1->super_AmrLevel).m_factory._M_t.
                          super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                          .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                          _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                          &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (pEVar3 != (EBFArrayBoxFactory *)0x0) {
    memcpy(&mgn,&(pNVar1->super_AmrLevel).geom,200);
    __l._M_len = 1;
    __l._M_array = (iterator)&mgn;
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::vector
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&mlmg_lobc,__l,
               &local_9c9);
    amrex::BoxArray::BoxArray((BoxArray *)local_908,this->grids);
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_908;
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&mlmg_hibc,__l_00,
               &local_9ca);
    std::__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_990,
               (__shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2> *)
               this->dmap);
    __l_01._M_len = 1;
    __l_01._M_array = (iterator)&local_990;
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::vector
              (&local_928,__l_01,&local_9cb);
    __l_02._M_len = 1;
    __l_02._M_array = &local_910;
    local_910 = pEVar3;
    std::
    vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>::
    vector((vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
            *)&local_940,__l_02,&local_9cc);
    amrex::MLEBABecLap::MLEBABecLap
              (&mlabec,(Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&mlmg_lobc,
               (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&mlmg_hibc,
               (Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
               &local_928,&local_960,
               (Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
                *)&local_940,1);
    std::
    _Vector_base<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
    ::~_Vector_base(&local_940);
    std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::~vector
              (&local_928);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_990._M_refcount);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&mlmg_hibc);
    amrex::BoxArray::~BoxArray((BoxArray *)local_908);
    std::_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>::~_Vector_base
              ((_Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)&mlmg_lobc);
    mlabec.super_MLCellABecLap.super_MLCellLinOp.super_MLLinOp.maxorder = max_order;
    setDomainBC(this,&mlmg_lobc,&mlmg_hibc,comp);
    amrex::MLLinOp::setDomainBC((MLLinOp *)&mlabec,&mlmg_lobc,&mlmg_hibc);
    amrex::MultiFab::MultiFab((MultiFab *)&mgn);
    iVar2 = local_9b4;
    betaComp_00 = local_9b8;
    if (0 < this->level) {
      pNVar1 = this->coarser->navier_stokes;
      local_908._0_8_ = (pointer)0x1;
      local_908._8_8_ = 0;
      local_908._16_8_ = 0;
      local_908._24_8_ = 0;
      local_908._32_8_ = 0;
      amrex::MultiFab::define
                ((MultiFab *)&mgn,&(pNVar1->super_AmrLevel).grids,&(pNVar1->super_AmrLevel).dmap,1,1
                 ,(MFInfo *)local_908,
                 (pNVar1->super_AmrLevel).m_factory._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_908 + 0x10));
      amrex::AmrLevel::FillPatch(&pNVar1->super_AmrLevel,(MultiFab *)&mgn,1,local_9c8,0,comp,1,0);
      if (iVar2 == 2) {
        pMVar4 = NavierStokesBase::get_rho(pNVar1,local_9c8);
        amrex::MultiFab::Divide((MultiFab *)&mgn,pMVar4,0,0,1,1);
      }
      amrex::MLLinOp::setCoarseFineBC
                ((MLLinOp *)&mlabec,(MultiFab *)&mgn,(this->crse_ratio).vect[0]);
    }
    amrex::AmrLevel::FillPatch(&this->navier_stokes->super_AmrLevel,&s_tmp,1,local_9c8,0,comp,1,0);
    if (iVar2 == 2) {
      pMVar4 = NavierStokesBase::get_rho(this->navier_stokes,local_9c8);
      amrex::MultiFab::Divide(&s_tmp,pMVar4,0,0,1,1);
    }
    amrex::MLCellLinOp::setLevelBC
              ((MLCellLinOp *)&mlabec,0,&s_tmp,(MultiFab *)0x0,(MultiFab *)0x0,(MultiFab *)0x0);
    amrex::MultiFab::~MultiFab((MultiFab *)&mgn);
    amrex::MLEBABecLap::setScalars(&mlabec,0.0,-1.0);
    setBeta(&mlabec,beta,betaComp_00,1);
    amrex::MLMG::MLMG(&mgn,(MLLinOp *)&mlabec);
    mgn.verbose = verbose;
    mlmg_hibc._M_elems._0_8_ = &visc_tmp;
    __l_03._M_len = 1;
    __l_03._M_array = (iterator)&mlmg_hibc;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_908,__l_03,
               (allocator_type *)&local_940);
    __l_04._M_len = 1;
    __l_04._M_array = (iterator)&local_928;
    local_928.
    super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&s_tmp;
    std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
              ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mlmg_lobc,__l_04,
               (allocator_type *)&local_990);
    amrex::MLMG::apply(&mgn,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                            local_908,
                       (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mlmg_lobc);
    std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
              ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&mlmg_lobc);
    std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
              ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_908);
    pEVar3 = (EBFArrayBoxFactory *)
             __dynamic_cast((this->navier_stokes->super_AmrLevel).m_factory._M_t.
                            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                            _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                            &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (pEVar3 != (EBFArrayBoxFactory *)0x0) {
      pMVar4 = amrex::EBFArrayBoxFactory::getVolFrac(pEVar3);
      amrex::single_level_weighted_redistribute
                (&visc_tmp,visc_terms,pMVar4,comp - local_9bc,1,
                 &(this->navier_stokes->super_AmrLevel).geom);
      amrex::MLMG::~MLMG(&mgn);
      amrex::MLEBABecLap::~MLEBABecLap(&mlabec);
      amrex::MultiFab::~MultiFab(&s_tmp);
      amrex::MultiFab::~MultiFab(&visc_tmp);
      return;
    }
    __cxa_bad_cast();
  }
  __cxa_bad_cast();
}

Assistant:

void
Diffusion::getViscTerms (MultiFab&              visc_terms,
                         int                    src_comp,
                         int                    comp,
                         Real                   time,
                         int                    rho_flag,
                         const MultiFab* const* beta,
                         int                    betaComp)
{
    int allthere;
    checkBeta(beta, allthere);
    //
    // Before computing the godunov predictors we may have to
    // precompute the viscous source terms.  To do this we must
    // construct a Laplacian operator, set the coeficients and apply
    // it to the time N data.  First, however, we must precompute the
    // fine N bndry values.  We will do this for each scalar that diffuses.
    //
    // Note: This routine DOES NOT fill grow cells
    //

    //
    // FIXME
    // LinOp classes cannot handle multcomponent MultiFabs yet,
    // construct the components one at a time and copy to visc_terms.
    //

    if (is_diffusive[comp])
    {
        int ng = 1;
        int ng_visc(2);// needed for redistribution
        MultiFab visc_tmp(grids,dmap,1,ng_visc,MFInfo(),navier_stokes->Factory()),
                 s_tmp(grids,dmap,1,ng,MFInfo(),navier_stokes->Factory());
	// not sure this is needed...
        visc_tmp.setVal(0.);
        //
        // Set up operator and apply to compute viscous terms.
        //
        const Real a = 0.0;
        const Real b = -1.0;

	LPInfo info;
	info.setAgglomeration(agglomeration);
	info.setConsolidation(consolidation);
	info.setMaxCoarseningLevel(0);

#ifdef AMREX_USE_EB
	const auto& ebf = &(dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory()));
	MLEBABecLap mlabec({navier_stokes->Geom()}, {grids}, {dmap}, info, {ebf});
#else
	MLABecLaplacian mlabec({navier_stokes->Geom()},{grids},{dmap},info);
#endif

	mlabec.setMaxOrder(max_order);

	{
	  // set BCs

	  std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_lobc;
	  std::array<LinOpBCType,AMREX_SPACEDIM> mlmg_hibc;
	  setDomainBC(mlmg_lobc, mlmg_hibc, comp);

	  mlabec.setDomainBC(mlmg_lobc, mlmg_hibc);

	  MultiFab crsedata;

	  if (level > 0) {
	    auto& crse_ns = *(coarser->navier_stokes);
	    crsedata.define(crse_ns.boxArray(), crse_ns.DistributionMap(), 1, ng,MFInfo(),crse_ns.Factory());
	    AmrLevel::FillPatch(crse_ns,crsedata,ng,time,State_Type,comp,1);
	    if (rho_flag == 2) {
	      // We want to evaluate (div beta grad) S, not rho*S.
	      const MultiFab& rhotime = crse_ns.get_rho(time);
	      MultiFab::Divide(crsedata,rhotime,0,0,1,ng);
	    }
	    mlabec.setCoarseFineBC(&crsedata, crse_ratio[0]);
	  }

	  AmrLevel::FillPatch(*navier_stokes,s_tmp,ng,time,State_Type,comp,1);
	  if (rho_flag == 2) {
	    const MultiFab& rhotime = navier_stokes->get_rho(time);
	    MultiFab::Divide(s_tmp,rhotime,0,0,1,ng);
	  }
	  mlabec.setLevelBC(0, &s_tmp);
	}

	mlabec.setScalars(a,b);
	// mlabec.setACoeffs() not needed since a = 0.0


	setBeta(mlabec, beta, betaComp);

	// Do we need something like this cribbed from mfix???
	// This sets the coefficient on the wall and defines it as a homogeneous
	// Dirichlet bc for the solve. mu_g is the viscosity at cc in mfix
	// matches what's in bcoeff
	//mlabec.setEBHomogDirichlet ( 0, (*mu_g[lev]) );

	MLMG mgn(mlabec);
	mgn.setVerbose(verbose);
	mgn.apply({&visc_tmp},{&s_tmp});

#ifdef AMREX_USE_EB
        const amrex::MultiFab* weights;
        const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(navier_stokes->Factory());
        weights = &(ebfactory.getVolFrac());

        amrex::single_level_weighted_redistribute(visc_tmp, visc_terms, *weights, comp-src_comp, 1,
                                         navier_stokes->Geom());
#else
	MultiFab::Copy(visc_terms,visc_tmp,0,comp-src_comp,1,0);
#endif

    }
    else
    {
      int ngrow = visc_terms.nGrow();
      visc_terms.setVal(0.0,comp-src_comp,1,ngrow);
    }
}